

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O1

VariableValue * __thiscall rsg::VariableValue::operator=(VariableValue *this,VariableValue *other)

{
  Variable *this_00;
  pointer __src;
  pointer __dest;
  int iVar1;
  
  this_00 = other->m_variable;
  this->m_variable = this_00;
  iVar1 = VariableType::getScalarSize(&this_00->m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->m_storage).m_value,(long)iVar1);
  __src = (other->m_storage).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
          _M_impl.super__Vector_impl_data._M_start;
  __dest = (this->m_storage).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar1 = VariableType::getScalarSize(&this->m_variable->m_type);
  if (iVar1 != 0) {
    memmove(__dest,__src,(long)iVar1 << 2);
  }
  return this;
}

Assistant:

VariableValue& VariableValue::operator= (const VariableValue& other)
{
	m_variable	= other.m_variable;
	m_storage.setStorage(getType());
	m_storage.getValue(getType()) = other.getValue().value();
	return *this;
}